

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_bms.cpp
# Opt level: O0

void __thiscall BmsBms::Merge(BmsBms *this,BmsBms *other)

{
  double measure;
  _Base_ptr p_Var1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  pointer ppVar5;
  pointer ppVar6;
  BmsRegistArray *pBVar7;
  BmsDuplicateHeaderException *pBVar8;
  BmsRegistArray *this_00;
  string *value;
  pointer ppVar9;
  pointer ppVar10;
  pointer ppVar11;
  BmsWord *channel_number;
  BmsChannel *this_01;
  BmsBuffer *pBVar12;
  reference ppBVar13;
  __normal_iterator<BmsBuffer_**,_std::vector<BmsBuffer_*,_std::allocator<BmsBuffer_*>_>_> local_d0;
  __normal_iterator<BmsBuffer_**,_std::vector<BmsBuffer_*,_std::allocator<BmsBuffer_*>_>_> local_c8;
  __normal_iterator<BmsBuffer_*const_*,_std::vector<BmsBuffer_*,_std::allocator<BmsBuffer_*>_>_>
  local_c0;
  ConstIterator current_buffer;
  BmsChannel *current_channel;
  ConstIterator CStack_a8;
  uint i_1;
  _Self local_a0;
  ConstIterator it_4;
  _Self local_90;
  Iterator it_3;
  double ratio;
  _Self local_78;
  ConstIterator it_2;
  _Self local_68;
  ConstIterator it_1;
  BmsWord word;
  uint i;
  _Self local_28;
  _Self local_20;
  Iterator it;
  BmsBms *other_local;
  BmsBms *this_local;
  
  it._M_node = (_Base_ptr)other;
  local_20._M_node = (_Base_ptr)BmsHeaderTable::Begin_abi_cxx11_(&other->headers_);
  while( true ) {
    local_28._M_node = (_Base_ptr)BmsHeaderTable::End_abi_cxx11_(it._M_node);
    bVar2 = std::operator!=(&local_20,&local_28);
    if (!bVar2) {
      it_1._M_node._4_4_ = 0;
      do {
        if (0x50f < it_1._M_node._4_4_) {
          local_78._M_node =
               (_Base_ptr)BmsSTPManager::Begin((BmsSTPManager *)&it._M_node[0x85]._M_left);
          while( true ) {
            ratio = (double)BmsSTPManager::End((BmsSTPManager *)&it._M_node[0x85]._M_left);
            bVar2 = std::operator!=(&local_78,(_Self *)&ratio);
            if (!bVar2) break;
            ppVar9 = std::_Rb_tree_const_iterator<std::pair<const_double,_int>_>::operator->
                               (&local_78);
            measure = ppVar9->first;
            ppVar9 = std::_Rb_tree_const_iterator<std::pair<const_double,_int>_>::operator->
                               (&local_78);
            BmsSTPManager::Add(&this->stp_manager_,measure,ppVar9->second);
            std::_Rb_tree_const_iterator<std::pair<const_double,_int>_>::operator++(&local_78);
          }
          uVar3 = BmsBarManager::GetResolution((BmsBarManager *)&it._M_node[4]._M_left);
          uVar4 = BmsBarManager::GetResolution(&this->bar_manager_);
          if (uVar3 != uVar4) {
            uVar3 = BmsBarManager::GetResolution((BmsBarManager *)&it._M_node[4]._M_left);
            uVar4 = BmsBarManager::GetResolution(&this->bar_manager_);
            it_3._M_node = (_Base_ptr)((double)uVar3 / (double)uVar4);
            BmsBarManager::SetResolution(&this->bar_manager_,(double)it_3._M_node);
            local_90._M_node = (_Base_ptr)BmsChannelManager::Begin(&this->channel_manager_);
            while( true ) {
              it_4._M_node = (_Base_ptr)BmsChannelManager::End(&this->channel_manager_);
              bVar2 = std::operator!=(&local_90,(_Self *)&it_4);
              if (!bVar2) break;
              ppVar10 = std::_Rb_tree_iterator<std::pair<const_BmsWord,_BmsChannel_*>_>::operator->
                                  (&local_90);
              BmsChannel::MultiplyBarDivisionCount(ppVar10->second,(double)it_3._M_node);
              std::_Rb_tree_iterator<std::pair<const_BmsWord,_BmsChannel_*>_>::operator++(&local_90)
              ;
            }
          }
          local_a0._M_node = (_Base_ptr)BmsChannelManager::Begin(it._M_node + 3);
          while( true ) {
            CStack_a8 = BmsChannelManager::End(it._M_node + 3);
            bVar2 = std::operator!=(&local_a0,&stack0xffffffffffffff58);
            if (!bVar2) break;
            current_channel._4_4_ = 0;
            ppVar11 = std::_Rb_tree_const_iterator<std::pair<const_BmsWord,_BmsChannel_*>_>::
                      operator->(&local_a0);
            current_buffer._M_current = (BmsBuffer **)ppVar11->second;
            local_c8._M_current =
                 (BmsBuffer **)BmsChannel::Begin((BmsChannel *)current_buffer._M_current);
            __gnu_cxx::
            __normal_iterator<BmsBuffer*const*,std::vector<BmsBuffer*,std::allocator<BmsBuffer*>>>::
            __normal_iterator<BmsBuffer**>
                      ((__normal_iterator<BmsBuffer*const*,std::vector<BmsBuffer*,std::allocator<BmsBuffer*>>>
                        *)&local_c0,&local_c8);
            while( true ) {
              local_d0._M_current = (BmsBuffer **)BmsChannel::End(current_buffer._M_current);
              bVar2 = __gnu_cxx::operator!=(&local_c0,&local_d0);
              if (!bVar2) break;
              channel_number = BmsChannel::GetChannelNumber((BmsChannel *)current_buffer._M_current)
              ;
              this_01 = BmsChannelManager::operator[](&this->channel_manager_,channel_number);
              pBVar12 = BmsChannel::operator[](this_01,current_channel._4_4_);
              ppBVar13 = __gnu_cxx::
                         __normal_iterator<BmsBuffer_*const_*,_std::vector<BmsBuffer_*,_std::allocator<BmsBuffer_*>_>_>
                         ::operator*(&local_c0);
              (*pBVar12->_vptr_BmsBuffer[2])(pBVar12,*ppBVar13);
              current_channel._4_4_ = current_channel._4_4_ + 1;
              __gnu_cxx::
              __normal_iterator<BmsBuffer_*const_*,_std::vector<BmsBuffer_*,_std::allocator<BmsBuffer_*>_>_>
              ::operator++(&local_c0);
            }
            std::_Rb_tree_const_iterator<std::pair<const_BmsWord,_BmsChannel_*>_>::operator++
                      (&local_a0);
          }
          return;
        }
        BmsWord::BmsWord((BmsWord *)&it_1,it_1._M_node._4_4_);
        local_68._M_node =
             (_Base_ptr)
             BmsRegistArraySet::Begin_abi_cxx11_((BmsRegistArraySet *)&it._M_node[1]._M_left);
        while( true ) {
          it_2._M_node = (_Base_ptr)
                         BmsRegistArraySet::End_abi_cxx11_
                                   ((BmsRegistArraySet *)&it._M_node[1]._M_left);
          bVar2 = std::operator!=(&local_68,(_Self *)&it_2);
          if (!bVar2) break;
          ppVar6 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BmsRegistArray_*>_>
                   ::operator->(&local_68);
          bVar2 = BmsRegistArraySet::Exists(&this->array_set_,&ppVar6->first);
          if (!bVar2) {
            ppVar6 = std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BmsRegistArray_*>_>
                     ::operator->(&local_68);
            BmsRegistArraySet::MakeNewArray(&this->array_set_,&ppVar6->first);
          }
          p_Var1 = it._M_node + 1;
          ppVar6 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BmsRegistArray_*>_>
                   ::operator->(&local_68);
          pBVar7 = BmsRegistArraySet::operator[]
                             ((BmsRegistArraySet *)&p_Var1->_M_left,&ppVar6->first);
          bVar2 = BmsRegistArray::IsExists(pBVar7,(BmsWord *)&it_1);
          if (bVar2) {
            ppVar6 = std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BmsRegistArray_*>_>
                     ::operator->(&local_68);
            pBVar7 = BmsRegistArraySet::operator[](&this->array_set_,&ppVar6->first);
            bVar2 = BmsRegistArray::IsExists(pBVar7,(BmsWord *)&it_1);
            if (bVar2) {
              pBVar8 = (BmsDuplicateHeaderException *)__cxa_allocate_exception(0x28);
              ppVar6 = std::
                       _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BmsRegistArray_*>_>
                       ::operator->(&local_68);
              BmsDuplicateHeaderException::BmsDuplicateHeaderException(pBVar8,&ppVar6->first);
              __cxa_throw(pBVar8,&BmsDuplicateHeaderException::typeinfo,
                          BmsDuplicateHeaderException::~BmsDuplicateHeaderException);
            }
            ppVar6 = std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BmsRegistArray_*>_>
                     ::operator->(&local_68);
            pBVar7 = BmsRegistArraySet::operator[](&this->array_set_,&ppVar6->first);
            p_Var1 = it._M_node + 1;
            ppVar6 = std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BmsRegistArray_*>_>
                     ::operator->(&local_68);
            this_00 = BmsRegistArraySet::operator[]
                                ((BmsRegistArraySet *)&p_Var1->_M_left,&ppVar6->first);
            value = BmsRegistArray::operator[][abi_cxx11_(this_00,(BmsWord *)&it_1);
            BmsRegistArray::Set(pBVar7,(BmsWord *)&it_1,value);
          }
          std::
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BmsRegistArray_*>_>
          ::operator++(&local_68);
        }
        BmsWord::~BmsWord((BmsWord *)&it_1);
        it_1._M_node._4_4_ = it_1._M_node._4_4_ + 1;
      } while( true );
    }
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BmsHeader>_>
             ::operator->(&local_20);
    bVar2 = BmsHeaderTable::IsExists(&this->headers_,&ppVar5->first);
    if (bVar2) break;
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BmsHeader>_>
             ::operator->(&local_20);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BmsHeader>_>
    ::operator->(&local_20);
    BmsHeader::ToString_abi_cxx11_((BmsHeader *)&word);
    BmsHeaderTable::Set(&this->headers_,&ppVar5->first,(string *)&word);
    std::__cxx11::string::~string((string *)&word);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BmsHeader>_>
    ::operator++(&local_20);
  }
  pBVar8 = (BmsDuplicateHeaderException *)__cxa_allocate_exception(0x28);
  ppVar5 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BmsHeader>_>
           ::operator->(&local_20);
  BmsDuplicateHeaderException::BmsDuplicateHeaderException(pBVar8,&ppVar5->first);
  __cxa_throw(pBVar8,&BmsDuplicateHeaderException::typeinfo,
              BmsDuplicateHeaderException::~BmsDuplicateHeaderException);
}

Assistant:

void
BmsBms::Merge(const BmsBms& other)
{
	// merge BmsHeaderTable
	// throw exception when duplicated header exists
	for (BmsHeaderTable::Iterator it = other.headers_.Begin(); it != other.headers_.End(); ++it) {
		if (headers_.IsExists(it->first)) {
			throw BmsDuplicateHeaderException(it->first);
		}
		headers_.Set(it->first, it->second.ToString());
	}
	// merge all registed information (#WAV, #BMP, etc channel)
	// if same key exists, then raise exception
	for (unsigned int i = 0; i < BmsConst::WORD_MAX_COUNT; ++i) {
		BmsWord word(i);
		for (BmsRegistArraySet::ConstIterator it = other.array_set_.Begin(); it != other.array_set_.End(); ++it) {
			if (NOT(array_set_.Exists(it->first))) {
				array_set_.MakeNewArray(it->first);
			}
			if (other.array_set_[it->first].IsExists(word)) {
				if (array_set_[it->first].IsExists(word)) {
					throw BmsDuplicateHeaderException(it->first);
				}
				array_set_[it->first].Set(word, other.array_set_[it->first][word]);
			}
		}
	}
	// merge STP
	for (auto it = other.stp_manager_.Begin(); it != other.stp_manager_.End(); ++it) {
		stp_manager_.Add(it->first, it->second);
	}

	// before channel merge, check resolution
	// other one is const, so there's only one way - match my resolution to others ...
	if (other.bar_manager_.GetResolution() != bar_manager_.GetResolution()) {
		double ratio = (double)other.bar_manager_.GetResolution() / bar_manager_.GetResolution();
		bar_manager_.SetResolution(ratio);
		for (auto it = channel_manager_.Begin(); it != channel_manager_.End(); ++it) {
			it->second->MultiplyBarDivisionCount(ratio);
		}
	}

	// merge channel
	for (BmsChannelManager::ConstIterator it = other.channel_manager_.Begin(); it != other.channel_manager_.End(); ++it) {
		unsigned int i = 0;
		BmsChannel& current_channel = *it->second;
		for (BmsChannel::ConstIterator current_buffer = current_channel.Begin(); current_buffer != current_channel.End(); ++current_buffer) {\
			channel_manager_[current_channel.GetChannelNumber()][i].Merge(**current_buffer);
			++i;
		}
	}
}